

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nfc_normalize.cpp
# Opt level: O3

string_t __thiscall
duckdb::NFCNormalizeOperator::Operation<duckdb::string_t,duckdb::string_t>
          (NFCNormalizeOperator *this,string_t input,Vector *result)

{
  anon_union_16_2_67f50693_for_value aVar1;
  long lVar2;
  char *pcVar3;
  ulong uVar4;
  ulong uVar5;
  ulong len;
  uint uVar6;
  anon_union_16_2_67f50693_for_value aVar7;
  undefined8 local_30;
  char *local_28;
  
  local_28 = input.value._0_8_;
  aVar1.pointer.ptr = local_28;
  aVar1._0_8_ = this;
  aVar7.pointer.ptr = local_28;
  aVar7._0_8_ = this;
  local_30 = this;
  uVar6 = (uint)this;
  pcVar3 = (char *)((long)&local_30 + 4);
  if (0xc < uVar6) {
    pcVar3 = local_28;
  }
  len = (ulong)this & 0xffffffff;
  uVar4 = (ulong)(uVar6 & 0xfffffff8);
  uVar5 = 8;
  while (uVar5 <= len) {
    lVar2 = uVar5 - 8;
    uVar5 = uVar5 + 8;
    if ((*(ulong *)(pcVar3 + lVar2) & 0x8080808080808080) != 0) goto LAB_010ff832;
  }
  if (uVar6 <= (uVar6 & 0xfffffff8)) {
    return (string_t)aVar7;
  }
  while (-1 < pcVar3[uVar4]) {
    uVar4 = uVar4 + 1;
    if (len == uVar4) {
      return (string_t)aVar1;
    }
  }
LAB_010ff832:
  pcVar3 = Utf8Proc::Normalize(pcVar3,len);
  aVar7.pointer =
       (anon_struct_16_3_d7536bce_for_pointer)StringVector::AddString(input.value._8_8_,pcVar3);
  free(pcVar3);
  return (anon_union_16_2_67f50693_for_value)(anon_union_16_2_67f50693_for_value)aVar7.pointer;
}

Assistant:

static RESULT_TYPE Operation(INPUT_TYPE input, Vector &result) {
		auto input_data = input.GetData();
		auto input_length = input.GetSize();
		if (IsAscii(input_data, input_length)) {
			return input;
		}
		auto normalized_str = Utf8Proc::Normalize(input_data, input_length);
		D_ASSERT(normalized_str);
		auto result_str = StringVector::AddString(result, normalized_str);
		free(normalized_str);
		return result_str;
	}